

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-stop.c
# Opt level: O2

int run_test_loop_stop(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined8 uStack_10;
  
  uVar2 = uv_default_loop();
  uv_prepare_init(uVar2,&prepare_handle);
  uv_prepare_start(&prepare_handle,prepare_cb);
  uVar2 = uv_default_loop();
  uv_timer_init(uVar2,&timer_handle);
  uv_timer_start(&timer_handle,timer_cb,100);
  uVar2 = uv_default_loop();
  iVar1 = uv_run(uVar2,0);
  if (iVar1 == 0) {
    pcVar3 = "r != 0";
    uStack_10 = 0x3a;
  }
  else if (timer_called == 1) {
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,2);
    if (iVar1 == 0) {
      pcVar3 = "r != 0";
      uStack_10 = 0x3e;
    }
    else if (prepare_called < 2) {
      pcVar3 = "prepare_called > 1";
      uStack_10 = 0x3f;
    }
    else {
      uVar2 = uv_default_loop();
      iVar1 = uv_run(uVar2,0);
      if (iVar1 == 0) {
        if (timer_called == 10) {
          if (prepare_called == 10) {
            return 0;
          }
          pcVar3 = "prepare_called == 10";
          uStack_10 = 0x44;
        }
        else {
          pcVar3 = "timer_called == 10";
          uStack_10 = 0x43;
        }
      }
      else {
        pcVar3 = "r == 0";
        uStack_10 = 0x42;
      }
    }
  }
  else {
    pcVar3 = "timer_called == 1";
    uStack_10 = 0x3b;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-stop.c"
          ,uStack_10,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(loop_stop) {
  int r;
  uv_prepare_init(uv_default_loop(), &prepare_handle);
  uv_prepare_start(&prepare_handle, prepare_cb);
  uv_timer_init(uv_default_loop(), &timer_handle);
  uv_timer_start(&timer_handle, timer_cb, 100, 100);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r != 0);
  ASSERT(timer_called == 1);

  r = uv_run(uv_default_loop(), UV_RUN_NOWAIT);
  ASSERT(r != 0);
  ASSERT(prepare_called > 1);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(timer_called == 10);
  ASSERT(prepare_called == 10);

  return 0;
}